

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

void google::protobuf::compiler::cpp::ListAllFields
               (FileDescriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  pointer *pppFVar1;
  iterator __position;
  long lVar2;
  long lVar3;
  FieldDescriptor *local_30;
  
  if (0 < *(int *)(d + 0x2c)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      ListAllFields((Descriptor *)(*(long *)(d + 0x58) + lVar3),fields);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x88;
    } while (lVar2 < *(int *)(d + 0x2c));
  }
  if (0 < *(int *)(d + 0x3c)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      local_30 = (FieldDescriptor *)(*(long *)(d + 0x70) + lVar2);
      __position._M_current =
           (fields->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (fields->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)fields,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        pppFVar1 = &(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x48;
    } while (lVar3 < *(int *)(d + 0x3c));
  }
  return;
}

Assistant:

void ListAllFields(const FileDescriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect file level message.
  for (int i = 0; i < d->message_type_count(); i++) {
    ListAllFields(d->message_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
}